

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_set_exif(spng_ctx *ctx,spng_exif *exif)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 1;
  if ((exif != (spng_exif *)0x0 && ctx != (spng_ctx *)0x0) &&
     (((ctx->data != (uchar *)0x0 || (iVar3 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
      (iVar3 = read_chunks(ctx,0), iVar3 == 0)))) {
    iVar4 = check_exif(exif);
    iVar3 = 0x3d;
    if (iVar4 == 0) {
      pcVar2 = (ctx->exif).data;
      if ((pcVar2 != (char *)0x0) && (((ctx->user).field_0x1 & 0x80) == 0)) {
        (*(ctx->alloc).free_fn)(pcVar2);
      }
      pcVar2 = exif->data;
      (ctx->exif).length = exif->length;
      (ctx->exif).data = pcVar2;
      uVar1._0_4_ = ctx->user;
      uVar1._4_4_ = ctx->stored;
      ctx->user = (spng_chunk_bitfield)(int)(uVar1 | 0x800000008000);
      ctx->stored = (spng_chunk_bitfield)(int)((uVar1 | 0x800000008000) >> 0x20);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int spng_set_exif(spng_ctx *ctx, struct spng_exif *exif)
{
    SPNG_SET_CHUNK_BOILERPLATE(exif);

    if(check_exif(exif)) return SPNG_EEXIF;

    if(ctx->exif.data != NULL && !ctx->user.exif) spng__free(ctx, ctx->exif.data);

    ctx->exif = *exif;

    ctx->stored.exif = 1;
    ctx->user.exif = 1;

    return 0;
}